

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O2

void nrg::TimedExecution::push<std::function<void()>>(Queue *queue,function<void_()> *fn)

{
  _Manager_type p_Var1;
  QueueElement elem;
  QueueElement QStack_68;
  QueueElement local_40;
  
  local_40.when.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_40.what.super__Function_base._M_functor._8_8_ = 0;
  local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
  local_40.what._M_invoker = fn->_M_invoker;
  p_Var1 = (fn->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(fn->super__Function_base)._M_functor;
    local_40.what.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    (fn->super__Function_base)._M_manager = (_Manager_type)0x0;
    fn->_M_invoker = (_Invoker_type)0x0;
    local_40.what.super__Function_base._M_manager = p_Var1;
  }
  QueueElement::QueueElement(&QStack_68,&local_40);
  std::
  priority_queue<nrg::TimedExecution::QueueElement,_std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>,_std::greater<nrg::TimedExecution::QueueElement>_>
  ::push(queue,&QStack_68);
  std::_Function_base::~_Function_base(&QStack_68.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_40.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { now(), std::move(fn) };
        push(queue, std::move(elem));
    }